

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  stbi_uc sVar10;
  byte *pbVar11;
  byte *pbVar12;
  ushort uVar13;
  stbi_uc *psVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  int iVar19;
  long in_FS_OFFSET;
  stbi_uc local_a08 [31];
  byte bStack_9e9;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar11 = a->zbuffer;
    pbVar1 = a->zbuffer_end;
    uVar13 = 0;
    if (pbVar11 < pbVar1) {
      a->zbuffer = pbVar11 + 1;
      bVar9 = *pbVar11;
      pbVar11 = pbVar11 + 1;
    }
    else {
      bVar9 = 0;
    }
    pbVar12 = pbVar11;
    if (pbVar11 < pbVar1) {
      pbVar12 = pbVar11 + 1;
      a->zbuffer = pbVar12;
      uVar13 = (ushort)*pbVar11;
    }
    if ((((pbVar1 <= pbVar12) || ((ushort)((ushort)bVar9 << 8 | uVar13) % 0x1f != 0)) ||
        ((uVar13 & 0x20) != 0)) || ((bVar9 & 0xf) != 8)) {
LAB_0017d2d5:
      *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->hit_zeof_once = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  do {
    uVar2 = stbi__zreceive(a,1);
    uVar3 = stbi__zreceive(a,2);
    if (uVar3 == 0) {
      uVar3 = a->num_bits;
      if ((uVar3 & 7) != 0) {
        stbi__zreceive(a,uVar3 & 7);
        uVar3 = a->num_bits;
      }
      uVar17 = 0;
      while (0 < (int)uVar3) {
        uVar4 = a->code_buffer;
        *(char *)((long)z_codelength.fast + uVar17) = (char)uVar4;
        uVar17 = uVar17 + 1;
        a->code_buffer = uVar4 >> 8;
        uVar3 = uVar3 - 8;
        a->num_bits = uVar3;
      }
      if ((int)uVar3 < 0) goto LAB_0017d2d5;
      for (; uVar17 < 4; uVar17 = uVar17 + 1) {
        psVar14 = a->zbuffer;
        if (psVar14 < a->zbuffer_end) {
          a->zbuffer = psVar14 + 1;
          sVar10 = *psVar14;
        }
        else {
          sVar10 = '\0';
        }
        *(stbi_uc *)((long)z_codelength.fast + uVar17) = sVar10;
      }
      if ((z_codelength.fast[1] ^ z_codelength.fast[0]) != 0xffff) goto LAB_0017d2d5;
      psVar14 = a->zbuffer;
      uVar17 = (ulong)z_codelength.fast[0];
      if (a->zbuffer_end < psVar14 + uVar17) goto LAB_0017d2d5;
      pcVar18 = a->zout;
      if (a->zout_end < pcVar18 + uVar17) {
        iVar7 = stbi__zexpand(a,pcVar18,(uint)z_codelength.fast[0]);
        if (iVar7 == 0) {
          return 0;
        }
        psVar14 = a->zbuffer;
        pcVar18 = a->zout;
      }
      memcpy(pcVar18,psVar14,uVar17);
      a->zbuffer = a->zbuffer + uVar17;
      a->zout = a->zout + uVar17;
    }
    else {
      if (uVar3 == 1) {
        iVar7 = stbi__zbuild_huffman
                          (z,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar7 == 0) {
          return 0;
        }
        psVar14 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar7 = 0x20;
      }
      else {
        if (uVar3 == 3) {
          return 0;
        }
        uVar4 = stbi__zreceive(a,5);
        uVar5 = stbi__zreceive(a,5);
        uVar6 = stbi__zreceive(a,4);
        local_a08[0] = '\0';
        local_a08[1] = '\0';
        local_a08[2] = '\0';
        local_a08[3] = '\0';
        local_a08[4] = '\0';
        local_a08[5] = '\0';
        local_a08[6] = '\0';
        local_a08[7] = '\0';
        local_a08[8] = '\0';
        local_a08[9] = '\0';
        local_a08[10] = '\0';
        local_a08[0xb] = '\0';
        local_a08[0xc] = '\0';
        local_a08[0xd] = '\0';
        local_a08[0xe] = '\0';
        local_a08[0xf] = '\0';
        local_a08[0x10] = '\0';
        local_a08[0x11] = '\0';
        local_a08[0x12] = '\0';
        uVar3 = uVar6 + 4;
        if ((int)(uVar6 + 4) < 1) {
          uVar3 = 0;
        }
        for (uVar17 = 0; uVar3 != uVar17; uVar17 = uVar17 + 1) {
          uVar6 = stbi__zreceive(a,3);
          local_a08[(byte)(&stbi__compute_huffman_codes_length_dezigzag)[uVar17]] = (stbi_uc)uVar6;
        }
        iVar7 = stbi__zbuild_huffman(&z_codelength,local_a08,0x13);
        if (iVar7 == 0) {
          return 0;
        }
        iVar7 = uVar5 + 1;
        iVar19 = uVar5 + uVar4 + 0x102;
        iVar16 = 0;
        while( true ) {
          if (iVar19 <= iVar16) break;
          uVar3 = stbi__zhuffman_decode(a,&z_codelength);
          if (0x12 < uVar3) goto LAB_0017d2d5;
          if (uVar3 < 0x10) {
            lencodes[iVar16] = (stbi_uc)uVar3;
            iVar16 = iVar16 + 1;
          }
          else {
            if (uVar3 == 0x11) {
              uVar3 = stbi__zreceive(a,3);
              iVar15 = uVar3 + 3;
LAB_0017d002:
              uVar3 = 0;
            }
            else {
              if (uVar3 != 0x10) {
                uVar3 = stbi__zreceive(a,7);
                iVar15 = uVar3 + 0xb;
                goto LAB_0017d002;
              }
              uVar3 = stbi__zreceive(a,2);
              if (iVar16 == 0) goto LAB_0017d2d5;
              iVar15 = uVar3 + 3;
              uVar3 = (uint)lencodes[(long)iVar16 + -1];
            }
            if (iVar19 - iVar16 < iVar15) goto LAB_0017d2d5;
            memset(lencodes + iVar16,uVar3,(long)iVar15);
            iVar16 = iVar16 + iVar15;
          }
        }
        if (iVar19 != iVar16) goto LAB_0017d2d5;
        iVar16 = stbi__zbuild_huffman(z,lencodes,uVar4 + 0x101);
        if (iVar16 == 0) {
          return 0;
        }
        psVar14 = lencodes + (int)(uVar4 + 0x101);
      }
      iVar7 = stbi__zbuild_huffman(&a->z_distance,psVar14,iVar7);
      if (iVar7 == 0) {
        return 0;
      }
      pcVar18 = a->zout;
      while( true ) {
        while (uVar3 = stbi__zhuffman_decode(a,z), (int)uVar3 < 0x100) {
          if ((int)uVar3 < 0) goto LAB_0017d2d5;
          if (a->zout_end <= pcVar18) {
            iVar7 = stbi__zexpand(a,pcVar18,1);
            if (iVar7 == 0) {
              return 0;
            }
            pcVar18 = a->zout;
          }
          *pcVar18 = (char)uVar3;
          pcVar18 = pcVar18 + 1;
        }
        if (uVar3 == 0x100) break;
        if (0x11d < uVar3) goto LAB_0017d2d5;
        uVar17 = (ulong)(uVar3 - 0x101);
        uVar3 = stbi__zlength_base[uVar17];
        if (0xffffffffffffffeb < uVar17 - 0x1c) {
          uVar4 = stbi__zreceive(a,stbi__zlength_extra[uVar17]);
          uVar3 = uVar3 + uVar4;
        }
        uVar4 = stbi__zhuffman_decode(a,&a->z_distance);
        if (0x1d < uVar4) goto LAB_0017d2d5;
        iVar7 = stbi__zdist_base[uVar4];
        if (3 < uVar4) {
          uVar4 = stbi__zreceive(a,stbi__zdist_extra[uVar4]);
          iVar7 = iVar7 + uVar4;
        }
        if ((long)pcVar18 - (long)a->zout_start < (long)iVar7) goto LAB_0017d2d5;
        if ((long)a->zout_end - (long)pcVar18 < (long)(int)uVar3) {
          iVar16 = stbi__zexpand(a,pcVar18,uVar3);
          if (iVar16 == 0) {
            return 0;
          }
          pcVar18 = a->zout;
        }
        lVar8 = -(long)iVar7;
        if (iVar7 == 1) {
          if (uVar3 != 0) {
            memset(pcVar18,(uint)(byte)pcVar18[lVar8],(ulong)uVar3);
            pcVar18 = pcVar18 + (ulong)(uVar3 - 1) + 1;
          }
        }
        else {
          for (; uVar3 != 0; uVar3 = uVar3 - 1) {
            *pcVar18 = pcVar18[lVar8];
            pcVar18 = pcVar18 + 1;
          }
        }
      }
      a->zout = pcVar18;
      if ((a->hit_zeof_once != 0) && (a->num_bits < 0x10)) goto LAB_0017d2d5;
    }
    if (uVar2 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}